

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::SingleDocParser
          (SingleDocParser *this,Scanner *scanner,Directives *directives)

{
  CollectionStack *in_RDX;
  CollectionStack *in_RSI;
  unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *in_RDI;
  pointer in_stack_ffffffffffffffb8;
  
  *(undefined4 *)
   &(in_RDI->_M_t).
    super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>._M_t.
    super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>.
    super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl = 0;
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>._M_t.
  super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>.
  super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl = in_RSI;
  in_RDI[2]._M_t.
  super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>._M_t.
  super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>.
  super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl = in_RDX;
  operator_new(0x50);
  CollectionStack::CollectionStack((CollectionStack *)0xf24ca8);
  std::unique_ptr<YAML::CollectionStack,std::default_delete<YAML::CollectionStack>>::
  unique_ptr<std::default_delete<YAML::CollectionStack>,void>(in_RDI,in_stack_ffffffffffffffb8);
  memset(in_RDI + 4,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)0xf24cdb);
  in_RDI[10]._M_t.
  super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>._M_t.
  super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>.
  super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl = (CollectionStack *)0x0;
  return;
}

Assistant:

SingleDocParser::SingleDocParser(Scanner& scanner, const Directives& directives)
    : m_scanner(scanner),
      m_directives(directives),
      m_pCollectionStack(new CollectionStack),
      m_anchors{},
      m_curAnchor(0) {}